

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group.cpp
# Opt level: O2

void __thiscall geometry::Group::add_child(Group *this,Primitive *object)

{
  Primitive *local_68;
  BoundingBox local_60;
  
  object->parent = this;
  local_68 = object;
  primitive::Primitive::bounds(&local_60,object);
  core::BoundingBox::add_bounds(&this->m_bounds,&local_60);
  std::vector<geometry::primitive::Primitive_*,_std::allocator<geometry::primitive::Primitive_*>_>::
  push_back(&this->m_children,&local_68);
  return;
}

Assistant:

void geometry::Group::add_child(geometry::primitive::Primitive *object)
{
    object->parent = this;
    m_bounds.add_bounds(object->bounds());
    m_children.push_back(object);
}